

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::rescalePartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *scaleFactors,
          double *cumulativeScaleFactors,int fillWithOnes)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  bool bVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  double dVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar25 [64];
  
  if (0 < this->kPatternCount) {
    lVar19 = 0;
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      iVar2 = this->kPartialsPaddedStateCount;
      iVar3 = this->kCategoryCount;
      auVar24 = ZEXT816(0) << 0x40;
      auVar25 = ZEXT864(0) << 0x40;
      if (0 < iVar3) {
        iVar13 = iVar2 * (int)lVar19;
        iVar15 = 0;
        do {
          if (0 < this->kStateCount) {
            lVar17 = 0;
            do {
              auVar24._8_8_ = 0;
              auVar24._0_8_ = destP[iVar13 + lVar17];
              auVar24 = vmaxsd_avx(auVar24,auVar25._0_16_);
              auVar25 = ZEXT1664(auVar24);
              lVar17 = lVar17 + 1;
            } while (this->kStateCount != (int)lVar17);
          }
          auVar24 = auVar25._0_16_;
          iVar15 = iVar15 + 1;
          iVar13 = iVar13 + this->kPaddedPatternCount * iVar2;
        } while (iVar15 != iVar3);
      }
      uVar10 = vcmpsd_avx512f(auVar24,ZEXT816(0),0);
      bVar11 = (bool)((byte)uVar10 & 1);
      dVar20 = (double)((ulong)bVar11 * 0x3ff0000000000000 + (ulong)!bVar11 * auVar24._0_8_);
      if (0 < iVar3) {
        auVar26._0_8_ = 1.0 / dVar20;
        auVar26._8_8_ = 0;
        iVar13 = this->kStateCount;
        iVar14 = iVar2 * (int)lVar19;
        iVar15 = this->kPaddedPatternCount;
        auVar25 = vpbroadcastq_avx512f();
        auVar22 = vbroadcastsd_avx512f(auVar26);
        iVar16 = 0;
        do {
          if (0 < iVar13) {
            uVar18 = 0;
            do {
              auVar23 = vpbroadcastq_avx512f();
              auVar23 = vporq_avx512f(auVar23,auVar21);
              uVar12 = vpcmpuq_avx512f(auVar23,auVar25,2);
              pdVar1 = destP + (long)iVar14 + uVar18;
              auVar23._8_8_ = (ulong)((byte)(uVar12 >> 1) & 1) * (long)pdVar1[1];
              auVar23._0_8_ = (ulong)((byte)uVar12 & 1) * (long)*pdVar1;
              auVar23._16_8_ = (ulong)((byte)(uVar12 >> 2) & 1) * (long)pdVar1[2];
              auVar23._24_8_ = (ulong)((byte)(uVar12 >> 3) & 1) * (long)pdVar1[3];
              auVar23._32_8_ = (ulong)((byte)(uVar12 >> 4) & 1) * (long)pdVar1[4];
              auVar23._40_8_ = (ulong)((byte)(uVar12 >> 5) & 1) * (long)pdVar1[5];
              auVar23._48_8_ = (ulong)((byte)(uVar12 >> 6) & 1) * (long)pdVar1[6];
              auVar23._56_8_ = (uVar12 >> 7) * (long)pdVar1[7];
              auVar23 = vmulpd_avx512f(auVar22,auVar23);
              pdVar1 = destP + (long)iVar14 + uVar18;
              bVar11 = (bool)((byte)uVar12 & 1);
              bVar4 = (bool)((byte)(uVar12 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar12 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar12 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar12 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar12 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar12 >> 6) & 1);
              *pdVar1 = (double)((ulong)bVar11 * auVar23._0_8_ | (ulong)!bVar11 * (long)*pdVar1);
              pdVar1[1] = (double)((ulong)bVar4 * auVar23._8_8_ | (ulong)!bVar4 * (long)pdVar1[1]);
              pdVar1[2] = (double)((ulong)bVar5 * auVar23._16_8_ | (ulong)!bVar5 * (long)pdVar1[2]);
              pdVar1[3] = (double)((ulong)bVar6 * auVar23._24_8_ | (ulong)!bVar6 * (long)pdVar1[3]);
              pdVar1[4] = (double)((ulong)bVar7 * auVar23._32_8_ | (ulong)!bVar7 * (long)pdVar1[4]);
              pdVar1[5] = (double)((ulong)bVar8 * auVar23._40_8_ | (ulong)!bVar8 * (long)pdVar1[5]);
              pdVar1[6] = (double)((ulong)bVar9 * auVar23._48_8_ | (ulong)!bVar9 * (long)pdVar1[6]);
              pdVar1[7] = (double)((uVar12 >> 7) * auVar23._56_8_ |
                                  (ulong)!SUB81(uVar12 >> 7,0) * (long)pdVar1[7]);
              uVar18 = uVar18 + 8;
            } while ((iVar13 + 7U & 0xfffffff8) != uVar18);
          }
          iVar16 = iVar16 + 1;
          iVar14 = iVar14 + iVar2 * iVar15;
        } while (iVar16 != iVar3);
      }
      if ((this->kFlags & 0x400) == 0) {
        scaleFactors[lVar19] = dVar20;
        if (cumulativeScaleFactors != (double *)0x0) {
          dVar20 = log(dVar20);
LAB_0012c197:
          cumulativeScaleFactors[lVar19] = dVar20 + cumulativeScaleFactors[lVar19];
        }
      }
      else {
        dVar20 = log(dVar20);
        scaleFactors[lVar19] = dVar20;
        if (cumulativeScaleFactors != (double *)0x0) goto LAB_0012c197;
      }
      lVar19 = lVar19 + 1;
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (lVar19 < this->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
        REALTYPE* scaleFactors,
        REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {
    if (DEBUGGING_OUTPUT) {
        std::cerr << "destP (before rescale): \n";// << destP << "\n";
        for(int i=0; i<kPartialsSize; i++)
            fprintf(stderr,"destP[%d] = %.5f\n",i,destP[i]);
    }

    // TODO None of the code below has been optimized.
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        if (max == 0)
            max = 1.0;

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++)
                destP[offset++] *= oneOverMax;
        }

        if (kFlags & BEAGLE_FLAG_SCALERS_LOG) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
    if (DEBUGGING_OUTPUT) {
        for(int i=0; i<kPatternCount; i++)
            fprintf(stderr,"new scaleFactor[%d] = %.5f\n",i,scaleFactors[i]);
    }
}